

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O3

double __thiscall llvm::APFloat::remainder(APFloat *this,double __x,double __y)

{
  byte bVar1;
  byte bVar2;
  opStatus oVar3;
  integerPart *parts;
  long in_RSI;
  Storage *rhs;
  uint uVar4;
  uint uVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  MutableArrayRef<unsigned_long> parts_00;
  bool bStack_49;
  IEEEFloat IStack_48;
  
  if ((this->U).semantics != *(fltSemantics **)(in_RSI + 8)) {
    __assert_fail("&getSemantics() == &RHS.getSemantics() && \"Should only call on two APFloats with the same semantics\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                  ,0x3d3,"opStatus llvm::APFloat::remainder(const APFloat &)");
  }
  rhs = &this->U;
  if ((this->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
    dVar6 = detail::DoubleAPFloat::remainder((DoubleAPFloat *)&rhs->IEEE,__x,__y);
    return dVar6;
  }
  detail::IEEEFloat::IEEEFloat(&IStack_48,&rhs->IEEE);
  bVar1 = *(byte *)((long)&this->U + 0x12);
  oVar3 = detail::IEEEFloat::divide(&IStack_48,(IEEEFloat *)(in_RSI + 8),rmNearestTiesToEven);
  if (oVar3 != opDivByZero) {
    uVar4 = ((rhs->IEEE).semantics)->precision + 0x40;
    uVar5 = uVar4 >> 6;
    parts = (integerPart *)operator_new__((ulong)(uVar5 << 3));
    uVar4 = uVar4 & 0xffffffc0;
    parts_00.super_ArrayRef<unsigned_long>.Length._0_4_ = uVar5;
    parts_00.super_ArrayRef<unsigned_long>.Data = parts;
    parts_00.super_ArrayRef<unsigned_long>.Length._4_4_ = 0;
    oVar3 = detail::IEEEFloat::convertToInteger
                      (&IStack_48,parts_00,uVar4,true,rmNearestTiesToEven,&bStack_49);
    if (oVar3 != opInvalidOp) {
      oVar3 = detail::IEEEFloat::convertFromZeroExtendedInteger
                        (&IStack_48,parts,uVar4,true,rmNearestTiesToEven);
      if (oVar3 != opOK) {
        __assert_fail("fs==opOK",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x6c3,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::remainder(const IEEEFloat &)");
      }
      oVar3 = detail::IEEEFloat::multiply(&IStack_48,(IEEEFloat *)(in_RSI + 8),rmNearestTiesToEven);
      if ((oVar3 & ~opInexact) != opOK) {
        __assert_fail("fs==opOK || fs==opInexact",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x6c6,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::remainder(const IEEEFloat &)");
      }
      oVar3 = detail::IEEEFloat::addOrSubtract(&rhs->IEEE,&IStack_48,rmNearestTiesToEven,true);
      if ((oVar3 & (opUnderflow|opOverflow|opDivByZero|opInvalidOp)) != opOK) {
        __assert_fail("fs==opOK || fs==opInexact",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x6c9,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::remainder(const IEEEFloat &)");
      }
      bVar2 = *(byte *)((long)&this->U + 0x12);
      if ((bVar2 & 7) == 3) {
        *(byte *)((long)&this->U + 0x12) = bVar2 & 0xf3 | bVar1 & 8;
      }
    }
    operator_delete__(parts);
  }
  detail::IEEEFloat::~IEEEFloat(&IStack_48);
  return extraout_XMM0_Qa;
}

Assistant:

const fltSemantics &getSemantics() const { return *U.semantics; }